

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxPortFactory.cpp
# Opt level: O3

void __thiscall LinuxPortFactory::~LinuxPortFactory(LinuxPortFactory *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_PortFactoryBase)._vptr_PortFactoryBase =
       (_func_int **)&PTR__LinuxPortFactory_00118c10;
  if ((DIR *)this->_dir != (DIR *)0x0) {
    closedir((DIR *)this->_dir);
  }
  pcVar1 = (this->_empty)._M_dataplus._M_p;
  paVar2 = &(this->_empty).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

LinuxPortFactory::~LinuxPortFactory()
{
    if (_dir)
        closedir(_dir);
}